

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double levy_cdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0.0 < b) {
    if (a < x) {
      dVar1 = b / ((x - a) + (x - a));
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      dVar1 = r8_error_f(dVar1);
      dVar1 = 1.0 - dVar1;
    }
    return dVar1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"LEVY_CDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  B <= 0.0.\n");
  exit(1);
}

Assistant:

double levy_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LEVY_CDF evaluates the Levy CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 April 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//    Normally, A <= X.
//
//    Input, double A, B, the parameters of the PDF.
//    0 < B.
//
//    Output, double LEVY_CDF, the value of the PDF.
//
{
  double cdf;

  if ( b <= 0.0 )
  {
    cerr << "\n";
    cerr << "LEVY_CDF - Fatal error!\n";
    cerr << "  B <= 0.0.\n";
    exit ( 1 );
  }

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = 1.0 - r8_error_f ( sqrt ( b / ( 2.0 * ( x - a ) ) ) );
  }

  return cdf;
}